

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDefaultCollisionConfiguration.cpp
# Opt level: O3

void __thiscall
cbtDefaultCollisionConfiguration::~cbtDefaultCollisionConfiguration
          (cbtDefaultCollisionConfiguration *this)

{
  (this->super_cbtCollisionConfiguration)._vptr_cbtCollisionConfiguration =
       (_func_int **)&PTR__cbtDefaultCollisionConfiguration_00b489c8;
  if (this->m_ownsCollisionAlgorithmPool == true) {
    cbtAlignedFreeInternal(this->m_collisionAlgorithmPool->m_pool);
    cbtAlignedFreeInternal(this->m_collisionAlgorithmPool);
  }
  if (this->m_ownsPersistentManifoldPool == true) {
    cbtAlignedFreeInternal(this->m_persistentManifoldPool->m_pool);
    cbtAlignedFreeInternal(this->m_persistentManifoldPool);
  }
  (**this->m_convexConvexCreateFunc->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_convexConvexCreateFunc);
  (**this->m_convexConcaveCreateFunc->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_convexConcaveCreateFunc);
  (**this->m_swappedConvexConcaveCreateFunc->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_swappedConvexConcaveCreateFunc);
  (**this->m_compoundCreateFunc->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_compoundCreateFunc);
  (**this->m_compoundCompoundCreateFunc->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_compoundCompoundCreateFunc);
  (**this->m_swappedCompoundCreateFunc->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_swappedCompoundCreateFunc);
  (**this->m_emptyCreateFunc->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_emptyCreateFunc);
  (**this->m_sphereSphereCF->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_sphereSphereCF);
  (**this->m_sphereTriangleCF->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_sphereTriangleCF);
  (**this->m_triangleSphereCF->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_triangleSphereCF);
  (**this->m_boxBoxCF->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_boxBoxCF);
  (**this->m_convexPlaneCF->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_convexPlaneCF);
  (**this->m_planeConvexCF->_vptr_cbtCollisionAlgorithmCreateFunc)();
  cbtAlignedFreeInternal(this->m_planeConvexCF);
  (**this->m_pdSolver->_vptr_cbtConvexPenetrationDepthSolver)();
  cbtAlignedFreeInternal(this->m_pdSolver);
  return;
}

Assistant:

cbtDefaultCollisionConfiguration::~cbtDefaultCollisionConfiguration()
{
	if (m_ownsCollisionAlgorithmPool)
	{
		m_collisionAlgorithmPool->~cbtPoolAllocator();
		cbtAlignedFree(m_collisionAlgorithmPool);
	}
	if (m_ownsPersistentManifoldPool)
	{
		m_persistentManifoldPool->~cbtPoolAllocator();
		cbtAlignedFree(m_persistentManifoldPool);
	}

	m_convexConvexCreateFunc->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_convexConvexCreateFunc);

	m_convexConcaveCreateFunc->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_convexConcaveCreateFunc);
	m_swappedConvexConcaveCreateFunc->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_swappedConvexConcaveCreateFunc);

	m_compoundCreateFunc->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_compoundCreateFunc);

	m_compoundCompoundCreateFunc->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_compoundCompoundCreateFunc);

	m_swappedCompoundCreateFunc->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_swappedCompoundCreateFunc);

	m_emptyCreateFunc->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_emptyCreateFunc);

	m_sphereSphereCF->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_sphereSphereCF);

#ifdef USE_BUGGY_SPHERE_BOX_ALGORITHM
	m_sphereBoxCF->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_sphereBoxCF);
	m_boxSphereCF->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_boxSphereCF);
#endif  //USE_BUGGY_SPHERE_BOX_ALGORITHM

	m_sphereTriangleCF->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_sphereTriangleCF);
	m_triangleSphereCF->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_triangleSphereCF);
	m_boxBoxCF->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_boxBoxCF);

	m_convexPlaneCF->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_convexPlaneCF);
	m_planeConvexCF->~cbtCollisionAlgorithmCreateFunc();
	cbtAlignedFree(m_planeConvexCF);

	m_pdSolver->~cbtConvexPenetrationDepthSolver();

	cbtAlignedFree(m_pdSolver);
}